

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O0

void __thiscall sc_core::sc_module::sc_module(sc_module *this,sc_module_name *param_2)

{
  sc_simcontext *psVar1;
  sc_module_name *psVar2;
  sc_module *in_RDI;
  int in_stack_00000014;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000028;
  sc_severity in_stack_00000034;
  sc_module_name *mod_name;
  char *in_stack_00000048;
  sc_object *in_stack_00000050;
  sc_object_manager *in_stack_ffffffffffffffa0;
  
  psVar1 = sc_core::sc_get_curr_simcontext();
  sc_simcontext::get_object_manager(psVar1);
  psVar2 = sc_object_manager::top_of_module_name_stack(in_stack_ffffffffffffffa0);
  sc_module_name::operator_cast_to_char_(psVar2);
  sc_object::sc_object(in_stack_00000050,in_stack_00000048);
  sc_process_host::sc_process_host(&in_RDI->super_sc_process_host);
  (in_RDI->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00364d78;
  (in_RDI->super_sc_process_host)._vptr_sc_process_host = (_func_int **)&DAT_00364e20;
  sc_sensitive::sc_sensitive(&in_RDI->sensitive,in_RDI);
  sc_sensitive_pos::sc_sensitive_pos(&in_RDI->sensitive_pos,in_RDI);
  sc_sensitive_neg::sc_sensitive_neg(&in_RDI->sensitive_neg,in_RDI);
  in_RDI->m_end_module_called = false;
  in_RDI->m_port_vec =
       (vector<sc_core::sc_port_base_*,_std::allocator<sc_core::sc_port_base_*>_> *)0x0;
  in_RDI->m_port_index = 0;
  in_RDI->m_name_gen = (sc_name_gen *)0x0;
  in_RDI->m_module_name_p = (sc_module_name *)0x0;
  psVar1 = sc_object::simcontext(&in_RDI->super_sc_object);
  sc_simcontext::get_object_manager(psVar1);
  psVar2 = sc_object_manager::top_of_module_name_stack(in_stack_ffffffffffffffa0);
  if ((psVar2 != (sc_module_name *)0x0) && (psVar2->m_module_p == (sc_module *)0x0)) {
    sc_module_init((sc_module *)psVar1);
    sc_module_name::set_module(psVar2,in_RDI);
    in_RDI->m_module_name_p = psVar2;
    return;
  }
  sc_report_handler::report
            (in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000014);
  sc_abort();
}

Assistant:

sc_module::sc_module( const sc_module_name& )
: sc_object(::sc_core::sc_get_curr_simcontext()
                  ->get_object_manager()
                  ->top_of_module_name_stack()
                  ->operator const char*()),
  sensitive(this),
  sensitive_pos(this),
  sensitive_neg(this),
  m_end_module_called(false),
  m_port_vec(),
  m_port_index(0),
  m_name_gen(0),
  m_module_name_p(0)
{
    /* For those used to the old style of passing a name to sc_module,
       this constructor will reduce the chance of making a mistake */

    /* When this form is used, we better have a fresh sc_module_name
       on the top of the stack */
    sc_module_name* mod_name = 
        simcontext()->get_object_manager()->top_of_module_name_stack();
    if (0 == mod_name || 0 != mod_name->m_module_p) {
        SC_REPORT_ERROR( SC_ID_SC_MODULE_NAME_REQUIRED_, 0 );
        sc_abort(); // can't recover from here
    }
    sc_module_init();
    mod_name->set_module( this );
    m_module_name_p = mod_name; // must come after sc_module_init call.
}